

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O3

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::Pointer,_(ritobin::Category)8>::from_json
          (ErrorStackOption *__return_storage_ptr__,Pointer *value,json *json)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  const_iterator cVar4;
  const_reference pvVar5;
  reference json_00;
  reference value_00;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_t index;
  undefined8 uVar8;
  json_impl *this;
  const_iterator __begin3;
  const_iterator __end3;
  string local_f0;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_d0;
  string local_b0;
  string local_90;
  string local_70;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  if (json->m_type != object) {
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
         "pointer";
    pcVar6 = "json.is_object()";
LAB_0012897d:
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message =
         pcVar6;
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
    _M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->
                          super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                          _M_payload.
                          super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                          .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                          _M_payload + 0x20);
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20) = 0
    ;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                      _M_value.path.field_2 + 1) =
         CONCAT17(local_d0.m_object._7_1_,local_d0.m_object._0_7_);
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                      _M_value.path.field_2 + 8) =
         CONCAT71(local_d0.m_it.object_iterator._M_node._0_7_,local_d0.m_object._7_1_);
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
    _M_string_length = 0;
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
    return __return_storage_ptr__;
  }
  cVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
          ::_M_find_tr<char[5],void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                      *)(json->m_value).object,(char (*) [5])"name");
  if (cVar4._M_node ==
      (_Base_ptr)
      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
        *)(json->m_value).object + 8)) {
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
         "pointer";
    pcVar6 = "json.contains(\"name\")";
    goto LAB_0012897d;
  }
  if ((json->m_type != object) ||
     (cVar4 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[6],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(json->m_value).object,(char (*) [6])"items"),
     (_Rb_tree_header *)cVar4._M_node ==
     &(((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
         "pointer";
    pcVar6 = "json.contains(\"items\")";
    goto LAB_0012897d;
  }
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"name");
  bVar3 = hash_from_json<ritobin::FNV1a>(&value->name,pvVar5);
  if (!bVar3) {
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
         "pointer";
    pcVar6 = "hash_from_json(value.name, json[\"name\"])";
    goto LAB_0012897d;
  }
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"items");
  if (pvVar5->m_type != array) {
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
         "pointer";
    pcVar6 = "json[\"items\"].is_array()";
    goto LAB_0012897d;
  }
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"items");
  local_d0.m_object._0_7_ = SUB87(pvVar5,0);
  local_d0.m_object._7_1_ = (undefined1)((ulong)pvVar5 >> 0x38);
  local_d0.m_it.object_iterator._M_node._0_7_ = 0;
  local_d0.m_it.object_iterator._M_node._7_1_ = 0;
  local_d0.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_d0.m_it.primitive_iterator.m_it = -0x8000000000000000;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_begin(&local_d0);
  local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_50.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_50.m_object = pvVar5;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_end(&local_50);
  this = (json_impl *)0x0;
  while( true ) {
    bVar3 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator==(&local_d0,&local_50);
    if (bVar3) {
      (__return_storage_ptr__->
      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
      super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
      return __return_storage_ptr__;
    }
    json_00 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&local_d0);
    value_00 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<>
                         (&value->items);
    item_from_json(__return_storage_ptr__,value_00,json_00);
    if ((__return_storage_ptr__->
        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
        super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged == true) break;
    this = this + 1;
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&local_d0);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"items","");
  to_index(&local_90,&local_70);
  to_index_abi_cxx11_(&local_b0,this,index);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    uVar8 = local_90.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_b0._M_string_length + local_90._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar8 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_90._M_string_length <= (ulong)uVar8) {
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_b0,0,0,local_90._M_dataplus._M_p,local_90._M_string_length);
      goto LAB_00128a73;
    }
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_90,local_b0._M_dataplus._M_p,local_b0._M_string_length);
LAB_00128a73:
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar7->_M_dataplus)._M_p;
  paVar1 = &pbVar7->field_2;
  if (paVar2 == paVar1) {
    local_f0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_f0._M_dataplus._M_p = (pointer)paVar2;
  }
  local_f0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar7->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  ErrorStack::push((ErrorStack *)__return_storage_ptr__,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_object());
            bin_json_assert(json.contains("name"));
            bin_json_assert(json.contains("items"));
            bin_json_assert(hash_from_json(value.name, json["name"]));
            bin_json_assert(json["items"].is_array());
            auto const& json_items = json["items"];
            size_t index = 0;
            for (auto const& json_item: json_items) {
                auto& value_item = value.items.emplace_back();
                bin_json_rethrow(to_index("items") + to_index(index),
                                 item_from_json(value_item, json_item));
                ++index;
            }
            return std::nullopt;
        }